

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O0

string * duckdb::StringUtil::Format<std::__cxx11::string,int,int,int>
                   (string *fmt_str,
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
                   int params_1,int params_2,int params_3)

{
  string *in_RDX;
  undefined8 in_RSI;
  int params_3_00;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unaff_retaddr;
  string *in_stack_00000008;
  string local_48 [60];
  string *psVar1;
  
  params_3_00 = (int)((ulong)in_RSI >> 0x20);
  psVar1 = in_RDI;
  ::std::__cxx11::string::string(local_48,in_RDX);
  Exception::ConstructMessage<std::__cxx11::string,int,int,int>
            (in_stack_00000008,unaff_retaddr,(int)((ulong)psVar1 >> 0x20),(int)psVar1,params_3_00);
  ::std::__cxx11::string::~string(local_48);
  return in_RDI;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}